

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawSplineSegmentBezierCubic
               (Vector2 p1,Vector2 c2,Vector2 c3,Vector2 p4,float thick,Color color)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector2 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float local_208;
  float fStack_204;
  float local_1f8;
  float fStack_1f4;
  float local_1e8;
  float fStack_1e4;
  Vector2 local_1a8;
  undefined8 uStack_1a0;
  float local_198 [96];
  
  memset(local_198,0,0x180);
  local_228.x = 0.0;
  local_228.y = 0.0;
  uStack_220 = 0;
  iVar1 = 1;
  local_218 = p1.x;
  fStack_214 = p1.y;
  fVar7 = local_218;
  fVar9 = fStack_214;
  for (lVar2 = 0x10; lVar2 != 400; lVar2 = lVar2 + 0x10) {
    fVar6 = (float)iVar1 * 0.041666668;
    fVar3 = 1.0 - fVar6;
    fVar4 = powf(fVar3,3.0);
    fVar5 = fVar3 * fVar3 * 3.0 * fVar6;
    fVar8 = fVar6 * fVar6 * fVar3 * 3.0;
    fVar3 = powf(fVar6,3.0);
    local_208 = c2.x;
    fStack_204 = c2.y;
    local_1f8 = c3.x;
    fStack_1f4 = c3.y;
    local_1e8 = p4.x;
    fStack_1e4 = p4.y;
    fVar6 = fVar3 * local_1e8 + fVar8 * local_1f8 + fVar4 * local_218 + fVar5 * local_208;
    fVar3 = fVar3 * fStack_1e4 + fVar8 * fStack_1f4 + fVar4 * fStack_214 + fVar5 * fStack_204;
    fVar4 = fVar3 - fVar9;
    fVar8 = fVar6 - fVar7;
    fVar5 = (thick * 0.5) / SQRT(fVar8 * fVar8 + fVar4 * fVar4);
    if (lVar2 == 0x10) {
      local_228.y = -fVar8 * fVar5 + fVar9;
      local_228.x = fVar4 * fVar5 + fVar7;
      uStack_220 = CONCAT44(fVar5 * fVar8 + fVar9,-fVar4 * fVar5 + fVar7);
    }
    *(float *)((long)&local_1a8.x + lVar2) = fVar5 * fVar4 + fVar6;
    *(float *)((long)&local_1a8.y + lVar2) = fVar5 * -fVar8 + fVar3;
    *(float *)((long)local_198 + lVar2 + -8) = fVar5 * -fVar4 + fVar6;
    *(float *)((long)local_198 + lVar2 + -4) = fVar5 * fVar8 + fVar3;
    iVar1 = iVar1 + 1;
    fVar7 = fVar6;
    fVar9 = fVar3;
  }
  local_1a8 = local_228;
  uStack_1a0 = uStack_220;
  DrawTriangleStrip(&local_1a8,0x32,color);
  return;
}

Assistant:

void DrawSplineSegmentBezierCubic(Vector2 p1, Vector2 c2, Vector2 c3, Vector2 p4, float thick, Color color)
{
    const float step = 1.0f/SPLINE_SEGMENT_DIVISIONS;

    Vector2 previous = p1;
    Vector2 current = { 0 };
    float t = 0.0f;

    Vector2 points[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 1; i <= SPLINE_SEGMENT_DIVISIONS; i++)
    {
        t = step*(float)i;

        float a = powf(1.0f - t, 3);
        float b = 3.0f*powf(1.0f - t, 2)*t;
        float c = 3.0f*(1.0f - t)*powf(t, 2);
        float d = powf(t, 3);

        current.y = a*p1.y + b*c2.y + c*c3.y + d*p4.y;
        current.x = a*p1.x + b*c2.x + c*c3.x + d*p4.x;

        float dy = current.y - previous.y;
        float dx = current.x - previous.x;
        float size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

        if (i == 1)
        {
            points[0].x = previous.x + dy*size;
            points[0].y = previous.y - dx*size;
            points[1].x = previous.x - dy*size;
            points[1].y = previous.y + dx*size;
        }

        points[2*i + 1].x = current.x - dy*size;
        points[2*i + 1].y = current.y + dx*size;
        points[2*i].x = current.x + dy*size;
        points[2*i].y = current.y - dx*size;

        previous = current;
    }

    DrawTriangleStrip(points, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
}